

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::KahanSumState,duckdb::DoubleSumOperation<duckdb::KahanAdd>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  KahanSumState *source_00;
  KahanSumState *in_RCX;
  idx_t i;
  KahanSumState **tdata;
  KahanSumState **sdata;
  KahanSumState *target_00;
  
  FlatVector::GetData<duckdb::KahanSumState_const*>((Vector *)0x1b68d62);
  source_00 = (KahanSumState *)FlatVector::GetData<duckdb::KahanSumState*>((Vector *)0x1b68d71);
  for (target_00 = (KahanSumState *)0x0; target_00 < in_RCX;
      target_00 = (KahanSumState *)&target_00->field_0x1) {
    BaseSumOperation<duckdb::SumSetOperation,duckdb::KahanAdd>::
    Combine<duckdb::KahanSumState,duckdb::DoubleSumOperation<duckdb::KahanAdd>>
              (source_00,target_00,(AggregateInputData *)0x1b68dad);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}